

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_lookup_in_ipv4_t.c
# Opt level: O1

void run_tests(int mode,char *mode_desc)

{
  char *pcVar1;
  MMDB_s *mmdb;
  int mmdb_error;
  addrinfo *addresses;
  int gai_error;
  addrinfo hints;
  int local_8c;
  addrinfo *local_88;
  int local_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  sockaddr *psStack_60;
  char *local_58;
  addrinfo *paStack_50;
  MMDB_lookup_result_s local_48;
  
  pcVar1 = test_database_path("MaxMind-DB-test-ipv4-28.mmdb");
  mmdb = open_ok(pcVar1,mode,mode_desc);
  free(pcVar1);
  MMDB_lookup_string((MMDB_lookup_result_s *)local_78,mmdb,"::abcd",&local_7c,&local_8c);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/ipv6_lookup_in_ipv4_t.c"
                ,0x12,local_8c,"==",0xb,
                "MMDB_lookup_string sets mmdb_error to MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an IPv6 address in an IPv4-only database"
                ,0);
  local_78._8_8_ = (MMDB_s *)0x0;
  local_58 = (char *)0x0;
  paStack_50 = (addrinfo *)0x0;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  psStack_60 = (sockaddr *)0x0;
  local_78._0_4_ = 4;
  local_78._4_4_ = 10;
  local_7c = getaddrinfo("2001:db8:85a3:0:0:8a2e:370:7334",(char *)0x0,(addrinfo *)local_78,
                         &local_88);
  if (local_7c != 0) {
    pcVar1 = gai_strerror(local_7c);
    bail_out(0,"getaddrinfo failed: %s",pcVar1,0);
  }
  local_8c = 0;
  MMDB_lookup_sockaddr(&local_48,mmdb,(sockaddr *)local_88->ai_addr,&local_8c);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/ipv6_lookup_in_ipv4_t.c"
                ,0x25,local_8c,"==",0xb,
                "MMDB_lookup_sockaddr sets mmdb_error to MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an IPv6 address in an IPv4-only database"
                ,0);
  freeaddrinfo(local_88);
  MMDB_close(mmdb);
  free(mmdb);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "MaxMind-DB-test-ipv4-28.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    const char *ip = "::abcd";
    int gai_error, mmdb_error;
    MMDB_lookup_string(mmdb, ip, &gai_error, &mmdb_error);

    cmp_ok(mmdb_error,
           "==",
           MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR,
           "MMDB_lookup_string sets mmdb_error to "
           "MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an "
           "IPv6 address in an IPv4-only database");

    struct addrinfo hints = {.ai_family = AF_INET6, .ai_flags = AI_NUMERICHOST};

    struct addrinfo *addresses;
    gai_error = getaddrinfo(
        "2001:db8:85a3:0:0:8a2e:370:7334", NULL, &hints, &addresses);
    if (gai_error) {
        BAIL_OUT("getaddrinfo failed: %s", gai_strerror(gai_error));
    }

    mmdb_error = 0;
    MMDB_lookup_sockaddr(mmdb, addresses->ai_addr, &mmdb_error);

    cmp_ok(mmdb_error,
           "==",
           MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR,
           "MMDB_lookup_sockaddr sets mmdb_error to "
           "MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR when we try to look up an "
           "IPv6 address in an IPv4-only database");

    freeaddrinfo(addresses);
    MMDB_close(mmdb);
    free(mmdb);
}